

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O2

size_t perfetto::
       TrackEventInternedDataIndex<perfetto::internal::InternedDebugAnnotationValueTypeName,_27UL,_const_char_*,_perfetto::SmallInternedDataTraits>
       ::Get<>(EventContext *ctx,char **value)

{
  bool bVar1;
  size_t in_RAX;
  InternedDebugAnnotationValueTypeName *pIVar2;
  size_t iid;
  size_t local_18;
  
  local_18 = in_RAX;
  pIVar2 = GetOrCreateIndexForField(ctx->incremental_state_);
  bVar1 = SmallInternedDataTraits::Index<const_char_*>::LookUpOrInsert
                    (&(pIVar2->
                      super_TrackEventInternedDataIndex<perfetto::internal::InternedDebugAnnotationValueTypeName,_27UL,_const_char_*,_perfetto::SmallInternedDataTraits>
                      ).index_,&local_18,value);
  if (!bVar1) {
    internal::InternedDebugAnnotationValueTypeName::Add
              (&(ctx->incremental_state_->serialized_interned_data).msg_.super_InternedData,local_18
               ,*value);
  }
  return local_18;
}

Assistant:

static size_t Get(EventContext* ctx,
                    const ValueType& value,
                    Args&&... add_args) {
    // First check if the value exists in the dictionary.
    auto index_for_field = GetOrCreateIndexForField(ctx->incremental_state_);
    size_t iid;
    if (PERFETTO_LIKELY(index_for_field->index_.LookUpOrInsert(&iid, value))) {
      PERFETTO_DCHECK(iid);
      return iid;
    }

    // If not, we need to serialize the definition of the interned value into
    // the heap buffered message (which is committed to the trace when the
    // packet ends).
    PERFETTO_DCHECK(iid);
    InternedDataType::Add(
        ctx->incremental_state_->serialized_interned_data.get(), iid,
        std::move(value), std::forward<Args>(add_args)...);
    return iid;
  }